

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimetypeparser.cpp
# Opt level: O3

void __thiscall QMimeTypeXMLData::clear(QMimeTypeXMLData *this)

{
  QArrayData *pQVar1;
  
  this->hasGlobDeleteAll = false;
  if ((this->name).d.ptr != (char16_t *)0x0) {
    pQVar1 = &((this->name).d.d)->super_QArrayData;
    (this->name).d.d = (Data *)0x0;
    (this->name).d.ptr = (char16_t *)0x0;
    (this->name).d.size = 0;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
  }
  QHash<QString,_QString>::clear(&this->localeComments);
  if ((this->genericIconName).d.ptr != (char16_t *)0x0) {
    pQVar1 = &((this->genericIconName).d.d)->super_QArrayData;
    (this->genericIconName).d.d = (Data *)0x0;
    (this->genericIconName).d.ptr = (char16_t *)0x0;
    (this->genericIconName).d.size = 0;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
  }
  if ((this->iconName).d.ptr != (char16_t *)0x0) {
    pQVar1 = &((this->iconName).d.d)->super_QArrayData;
    (this->iconName).d.d = (Data *)0x0;
    (this->iconName).d.ptr = (char16_t *)0x0;
    (this->iconName).d.size = 0;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
  }
  QList<QString>::clear(&this->globPatterns);
  return;
}

Assistant:

void QMimeTypeXMLData::clear()
{
    hasGlobDeleteAll = false;
    name.clear();
    localeComments.clear();
    genericIconName.clear();
    iconName.clear();
    globPatterns.clear();
}